

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void binary(_Bool canAssign)

{
  TokenType TVar1;
  uint8_t uVar2;
  Chunk *chunk;
  
  TVar1 = parser.previous.type;
  parsePrecedence(rules[parser.previous.type].precedence + PREC_ASSIGNMENT);
  switch(TVar1) {
  case TOKEN_MINUS:
    chunk = &current->function->chunk;
    uVar2 = '\x13';
    break;
  case TOKEN_PLUS:
    chunk = &current->function->chunk;
    uVar2 = '\x12';
    break;
  default:
    return;
  case TOKEN_SLASH:
    chunk = &current->function->chunk;
    uVar2 = '\x15';
    break;
  case TOKEN_STAR:
    chunk = &current->function->chunk;
    uVar2 = '\x14';
    break;
  case TOKEN_BANG_EQUAL:
    uVar2 = '\x0f';
    goto LAB_00104569;
  case TOKEN_EQUAL_EQUAL:
    chunk = &current->function->chunk;
    uVar2 = '\x0f';
    break;
  case TOKEN_GREATER:
    chunk = &current->function->chunk;
    uVar2 = '\x10';
    break;
  case TOKEN_GREATER_EQUAL:
    uVar2 = '\x11';
    goto LAB_00104569;
  case TOKEN_LESS:
    chunk = &current->function->chunk;
    uVar2 = '\x11';
    break;
  case TOKEN_LESS_EQUAL:
    uVar2 = '\x10';
LAB_00104569:
    emitBytes(uVar2,'\x16');
    return;
  }
  writeChunk(chunk,uVar2,parser.previous.line);
  return;
}

Assistant:

static void binary(bool canAssign) {
    TokenType operatorType = parser.previous.type;

    ParseRule *rule = getRule(operatorType);
    parsePrecedence((Precedence) (rule->precedence + 1));

    switch (operatorType) {
        case TOKEN_BANG_EQUAL:
            emitBytes(OP_EQUAL, OP_NOT);
            break;
        case TOKEN_EQUAL_EQUAL:
            emitByte(OP_EQUAL);
            break;
        case TOKEN_GREATER:
            emitByte(OP_GREATER);
            break;
        case TOKEN_GREATER_EQUAL:
            emitBytes(OP_LESS, OP_NOT);
            break;
        case TOKEN_LESS:
            emitByte(OP_LESS);
            break;
        case TOKEN_LESS_EQUAL:
            emitBytes(OP_GREATER, OP_NOT);
            break;
        case TOKEN_PLUS:
            emitByte(OP_ADD);
            break;
        case TOKEN_MINUS:
            emitByte(OP_SUBTRACT);
            break;
        case TOKEN_STAR:
            emitByte(OP_MULTIPLY);
            break;
        case TOKEN_SLASH:
            emitByte(OP_DIVIDE);
            break;
        default:
            return; // Unreachable.
    }
}